

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

void Abc_NtkDumpBlif(Abc_Ntk_t *p)

{
  int iVar1;
  int local_30;
  uint local_2c;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  FILE *pFile;
  Abc_Ntk_t *p_local;
  
  pFile = (FILE *)p;
  vSupp = (Vec_Ptr_t *)fopen("multi_and.blif","wb");
  if ((FILE *)vSupp == (FILE *)0x0) {
    printf("Cannot open output file.\n");
  }
  else {
    fprintf((FILE *)vSupp,".model %s\n","multi_and");
    fprintf((FILE *)vSupp,".inputs");
    for (local_2c = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pFile), (int)local_2c < iVar1;
        local_2c = local_2c + 1) {
      fprintf((FILE *)vSupp," i%d",(ulong)local_2c);
    }
    fprintf((FILE *)vSupp,"\n");
    fprintf((FILE *)vSupp,".outputs");
    for (local_2c = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pFile), (int)local_2c < iVar1;
        local_2c = local_2c + 1) {
      fprintf((FILE *)vSupp," o%d",(ulong)local_2c);
    }
    fprintf((FILE *)vSupp,"\n");
    for (local_2c = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pFile), (int)local_2c < iVar1;
        local_2c = local_2c + 1) {
      _k = Abc_NtkCi((Abc_Ntk_t *)pFile,local_2c);
      (_k->field_6).iTemp = local_2c;
    }
    for (local_2c = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pFile), (int)local_2c < iVar1;
        local_2c = local_2c + 1) {
      _k = Abc_NtkCo((Abc_Ntk_t *)pFile,local_2c);
      pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)pFile,(Abc_Obj_t **)&k,1);
      fprintf((FILE *)vSupp,".names");
      for (local_30 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_30 < iVar1;
          local_30 = local_30 + 1) {
        _k = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_30);
        fprintf((FILE *)vSupp," i%d",(ulong)(uint)(_k->field_6).iTemp);
      }
      fprintf((FILE *)vSupp," o%d\n",(ulong)local_2c);
      for (local_30 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_30 < iVar1;
          local_30 = local_30 + 1) {
        _k = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_30);
        fprintf((FILE *)vSupp,"1");
      }
      fprintf((FILE *)vSupp," 1\n");
      Vec_PtrFree((Vec_Ptr_t *)pObj);
    }
    fprintf((FILE *)vSupp,".end\n\n");
    fclose((FILE *)vSupp);
  }
  return;
}

Assistant:

void Abc_NtkDumpBlif( Abc_Ntk_t * p )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    int i, k;
    pFile = fopen( "multi_and.blif", "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return;
    }
    fprintf( pFile, ".model %s\n", "multi_and" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < Abc_NtkCiNum(p); i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    for ( i = 0; i < Abc_NtkCoNum(p); i++ )
        fprintf( pFile, " o%d", i );
    fprintf( pFile, "\n" );
    Abc_NtkForEachCi( p, pObj, i )
        pObj->iTemp = i;
    for ( i = 0; i < Abc_NtkCoNum(p); i++ )
    {
        pObj = Abc_NtkCo( p, i );
        vSupp = Abc_NtkNodeSupport( p, &pObj, 1 );
        fprintf( pFile, ".names" );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            fprintf( pFile, " i%d", pObj->iTemp );
        fprintf( pFile, " o%d\n", i );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            fprintf( pFile, "1" );
        fprintf( pFile, " 1\n" );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, ".end\n\n" );
    fclose( pFile );
}